

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filename.c
# Opt level: O2

void strip_fileext(char *path,char *root)

{
  size_t __n;
  long lVar1;
  size_t sVar2;
  
  sVar2 = strlen(path);
  do {
    if (sVar2 == 1) {
      strcpy(root,path);
      return;
    }
    __n = sVar2 - 1;
    lVar1 = sVar2 - 1;
    sVar2 = __n;
  } while (path[lVar1] != '.');
  strncpy(root,path,__n);
  return;
}

Assistant:

void
strip_fileext(const char *path, char *root)
{
    size_t i, l;

    l = strlen(path);
    for (i = l - 1; (i > 0) && (path[i] != '.'); --i);
    if (i == 0) {
        strcpy(root, path);     /* Didn't find a . */
    } else {
        strncpy(root, path, i);
    }
}